

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O2

void __thiscall wasm::CodePushing::doWalkFunction(CodePushing *this,Function *func)

{
  pointer puVar1;
  size_t __new_size;
  
  LocalAnalyzer::analyze(&this->analyzer,func);
  puVar1 = (this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->numGetsSoFar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  __new_size = Function::getNumLocals(func);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numGetsSoFar,__new_size);
  Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>::walk
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>_>
              ).super_PostWalker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>.
              super_Walker<wasm::CodePushing,_wasm::Visitor<wasm::CodePushing,_void>_>,&func->body);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // pre-scan to find which vars are sfa, and also count their gets&sets
    analyzer.analyze(func);
    // prepare to walk
    numGetsSoFar.clear();
    numGetsSoFar.resize(func->getNumLocals());
    // walk and optimize
    walk(func->body);
  }